

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::anon_unknown_240::HasReferencesRec
               (uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  PrimSpec *pPVar1;
  bool bVar2;
  bool bVar3;
  PrimSpec *child;
  PrimSpec *primspec_00;
  
  if (max_depth < depth) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (primspec[0x2e8] == (PrimSpec)0x0) {
      primspec_00 = *(PrimSpec **)(primspec + 0x48);
      pPVar1 = *(PrimSpec **)(primspec + 0x50);
      do {
        bVar3 = primspec_00 != pPVar1;
        if (primspec_00 == pPVar1) {
          return bVar3;
        }
        bVar2 = HasReferencesRec(depth + 1,primspec_00,max_depth);
        primspec_00 = primspec_00 + 0x568;
      } while (!bVar2);
    }
  }
  return bVar3;
}

Assistant:

bool HasReferencesRec(uint32_t depth, const PrimSpec &primspec,
                      const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  if (primspec.metas().references) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasReferencesRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}